

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS
ref_import_bin_ugrid_chunk(FILE *file,REF_BOOL swap,REF_BOOL fat,REF_INT n,REF_INT *chunk)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  REF_STATUS RVar4;
  void *__ptr;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  
  if (fat == 0) {
    __n = (size_t)n;
    sVar5 = fread(chunk,4,__n,(FILE *)file);
    if (sVar5 != __n) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x1da,"ref_import_bin_ugrid_chunk","int chunk",__n,sVar5);
      return 1;
    }
    if (n < 1 || swap == 0) {
      return 0;
    }
    uVar7 = 0;
    do {
      uVar1 = chunk[uVar7];
      chunk[uVar7] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
      ;
      uVar7 = uVar7 + 1;
    } while ((uint)n != uVar7);
    return 0;
  }
  if (n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x1ce,
           "ref_import_bin_ugrid_chunk","malloc actual of REF_LONG negative");
  }
  else {
    uVar7 = (ulong)(uint)n;
    __ptr = malloc(uVar7 * 8);
    if (__ptr == (void *)0x0) {
      bVar3 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x1ce,"ref_import_bin_ugrid_chunk","malloc actual of REF_LONG NULL");
      RVar4 = 2;
      goto LAB_00167a39;
    }
    sVar5 = fread(__ptr,8,uVar7,(FILE *)file);
    if (sVar5 == uVar7) {
      if (n != 0 && swap != 0) {
        uVar6 = 0;
        do {
          uVar2 = *(ulong *)((long)__ptr + uVar6 * 8);
          *(ulong *)((long)__ptr + uVar6 * 8) =
               uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      if (n != 0) {
        uVar7 = 1;
        if (1 < n) {
          uVar7 = (ulong)(uint)n;
        }
        uVar6 = 0;
        do {
          chunk[uVar6] = *(REF_INT *)((long)__ptr + uVar6 * 8);
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      free(__ptr);
      RVar4 = 1;
      bVar3 = true;
      goto LAB_00167a39;
    }
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x1cf,
           "ref_import_bin_ugrid_chunk","long chunk",uVar7,sVar5);
  }
  bVar3 = false;
  RVar4 = 1;
LAB_00167a39:
  if (bVar3) {
    return 0;
  }
  return RVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid_chunk(FILE *file, REF_BOOL swap,
                                                     REF_BOOL fat, REF_INT n,
                                                     REF_INT *chunk) {
  REF_INT i;
  if (fat) {
    REF_LONG *actual;
    ref_malloc(actual, n, REF_LONG);
    REIS(n, fread(actual, sizeof(REF_LONG), (size_t)(n), file), "long chunk");
    if (swap) {
      for (i = 0; i < n; i++) {
        SWAP_LONG(actual[i]);
      }
    }
    for (i = 0; i < n; i++) {
      chunk[i] = (REF_INT)actual[i];
    }
    ref_free(actual);
  } else {
    REIS(n, fread(chunk, sizeof(REF_INT), (size_t)(n), file), "int chunk");
    if (swap) {
      for (i = 0; i < n; i++) {
        SWAP_INT(chunk[i]);
      }
    }
  }

  return REF_SUCCESS;
}